

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetGlobals.cpp
# Opt level: O3

void __thiscall wasm::SetGlobals::run(SetGlobals *this,Module *module)

{
  pointer *ppbVar1;
  pointer *ppbVar2;
  int iVar3;
  uintptr_t uVar4;
  Type __nptr;
  Module *pMVar5;
  Global *pGVar6;
  int *piVar7;
  long lVar8;
  longlong lVar9;
  Const *pCVar10;
  string *errorTextIfMissing;
  size_type *psVar11;
  undefined8 input;
  string_view s;
  string_view sVar12;
  Literal local_280;
  anon_union_16_6_1532cd5a_for_Literal_0 local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [23];
  string *local_e0;
  undefined1 auStack_d8 [8];
  Literal lit;
  value_type value;
  Split pairs;
  undefined1 local_78 [8];
  value_type name;
  undefined1 local_50 [8];
  Split nameAndValue;
  
  ppbVar2 = &pairs.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  value.field_2._8_8_ = ppbVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&value.field_2 + 8),"set-globals","");
  ppbVar1 = &nameAndValue.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (undefined1  [8])ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"SetGlobals usage:  wasm-opt --pass-arg=set-globals@x=y,z=w","");
  errorTextIfMissing = (string *)local_50;
  Pass::getArgument((string *)&local_268.func,&this->super_Pass,(string *)((long)&value.field_2 + 8)
                    ,errorTextIfMissing);
  sVar12._M_str = (char *)0x0;
  sVar12._M_len = local_268.func.super_IString.str._M_len;
  sVar12 = IString::interned((IString *)local_268.func.super_IString.str._M_str,sVar12,
                             SUB81(errorTextIfMissing,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.i64 != local_258) {
    operator_delete(local_268.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_258[0]._M_allocated_capacity + 1);
  }
  if (local_50 != (undefined1  [8])ppbVar1) {
    operator_delete((void *)local_50,
                    (ulong)((long)&((nameAndValue.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  if ((pointer *)value.field_2._8_8_ != ppbVar2) {
    operator_delete((void *)value.field_2._8_8_,
                    (ulong)((long)&((pairs.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  local_268.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,sVar12._M_str,sVar12._M_str + sVar12._M_len);
  local_50 = (undefined1  [8])ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,",","");
  String::Split::Split
            ((Split *)((long)&value.field_2 + 8),(string *)&local_268.func,(string *)local_50);
  if (local_50 != (undefined1  [8])ppbVar1) {
    operator_delete((void *)local_50,
                    (ulong)((long)&((nameAndValue.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.i64 != local_258) {
    operator_delete(local_268.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_258[0]._M_allocated_capacity + 1);
  }
  local_e0 = pairs.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  input = value.field_2._8_8_;
  pMVar5 = module;
  if ((pointer)value.field_2._8_8_ !=
      pairs.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pairs._24_8_ = pMVar5;
      local_268.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"=","");
      String::Split::Split((Split *)local_50,(string *)input,(string *)&local_268.func);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268.i64 != local_258) {
        operator_delete(local_268.gcData.
                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_258[0]._M_allocated_capacity + 1);
      }
      local_78 = (undefined1  [8])&name._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,*(pointer *)local_50,
                 (long)&((*(pointer *)((long)local_50 + 8))->_M_dataplus)._M_p +
                 (long)&((*(pointer *)local_50)->_M_dataplus)._M_p);
      psVar11 = &value._M_string_length;
      lit.type.id = (uintptr_t)psVar11;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&lit.type,*(long *)((long)local_50 + 0x20),
                 *(long *)((long)local_50 + 0x28) + *(long *)((long)local_50 + 0x20));
      s._M_str = (char *)0x0;
      s._M_len = (size_t)local_78;
      sVar12 = IString::interned((IString *)name._M_dataplus._M_p,s,SUB81(psVar11,0));
      pGVar6 = Module::getGlobalOrNull(module,(Name)sVar12);
      __nptr = lit.type;
      if (pGVar6 == (Global *)0x0) {
        Fatal::Fatal((Fatal *)&local_268.func);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_258[0]._M_local_buf,"Could not find global: ",0x17);
        Fatal::operator<<((Fatal *)&local_268.func,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78);
LAB_00a39601:
        Fatal::~Fatal((Fatal *)&local_268.func);
      }
      auStack_d8 = (undefined1  [8])0x0;
      lit.field_0.i64 = 0;
      lit.field_0.func.super_IString.str._M_str = (char *)0x0;
      uVar4 = (pGVar6->type).id;
      if (uVar4 == 3) {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        *piVar7 = 0;
        lVar9 = strtoll((char *)__nptr.id,(char **)((long)&name.field_2 + 8),10);
        if (name.field_2._8_8_ == __nptr.id) {
LAB_00a394f6:
          std::__throw_invalid_argument("stoll");
LAB_00a39502:
          std::__throw_out_of_range("stoi");
        }
        if (*piVar7 == 0) {
          *piVar7 = iVar3;
        }
        else if (*piVar7 == 0x22) {
          std::__throw_out_of_range("stoll");
        }
        local_258[0]._M_allocated_capacity = 3;
        local_268.i64 = lVar9;
        Literal::operator=((Literal *)auStack_d8,(Literal *)&local_268.func);
      }
      else {
        if (uVar4 != 2) {
          Fatal::Fatal((Fatal *)&local_268.func);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_258[0]._M_local_buf,"global\'s type is not supported: ",0x20);
          Fatal::operator<<((Fatal *)&local_268.func,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78);
          goto LAB_00a39601;
        }
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        *piVar7 = 0;
        lVar8 = strtol((char *)__nptr.id,(char **)((long)&name.field_2 + 8),10);
        if (name.field_2._8_8_ == __nptr.id) {
          std::__throw_invalid_argument("stoi");
          goto LAB_00a394f6;
        }
        if (((int)lVar8 != lVar8) || (*piVar7 == 0x22)) goto LAB_00a39502;
        if (*piVar7 == 0) {
          *piVar7 = iVar3;
        }
        local_268.i32 = (int)lVar8;
        local_258[0]._M_allocated_capacity = 2;
        Literal::operator=((Literal *)auStack_d8,(Literal *)&local_268.func);
      }
      Literal::~Literal((Literal *)&local_268.func);
      module = (Module *)pairs._24_8_;
      local_268.i64 = pairs._24_8_;
      Literal::Literal(&local_280,(Literal *)auStack_d8);
      pCVar10 = Builder::makeConst((Builder *)&local_268.func,&local_280);
      pGVar6->init = (Expression *)pCVar10;
      Literal::~Literal(&local_280);
      (pGVar6->super_Importable).base.super_IString.str._M_len = 0;
      (pGVar6->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (pGVar6->super_Importable).module.super_IString.str._M_len = 0;
      (pGVar6->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      Literal::~Literal((Literal *)auStack_d8);
      if ((size_type *)lit.type.id != &value._M_string_length) {
        operator_delete((void *)lit.type.id,value._M_string_length + 1);
      }
      if (local_78 != (undefined1  [8])&name._M_string_length) {
        operator_delete((void *)local_78,name._M_string_length + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_50);
      input = input + 0x20;
      pMVar5 = (Module *)pairs._24_8_;
    } while ((string *)input != local_e0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.field_2 + 8));
  return;
}

Assistant:

void run(Module* module) override {
    Name input =
      getArgument("set-globals",
                  "SetGlobals usage:  wasm-opt --pass-arg=set-globals@x=y,z=w");

    // The input is a set of X=Y pairs separated by commas.
    String::Split pairs(input.toString(), ",");
    for (auto& pair : pairs) {
      String::Split nameAndValue(pair, "=");
      auto name = nameAndValue[0];
      auto value = nameAndValue[1];
      auto* glob = module->getGlobalOrNull(name);
      if (!glob) {
        Fatal() << "Could not find global: " << name;
      }
      // Parse the input.
      Literal lit;
      if (glob->type == Type::i32) {
        lit = Literal(int32_t(stoi(value)));
      } else if (glob->type == Type::i64) {
        lit = Literal(int64_t(stoll(value)));
      } else {
        Fatal() << "global's type is not supported: " << name;
      }
      // The global now has a value, and is not imported.
      glob->init = Builder(*module).makeConst(lit);
      glob->module = glob->base = Name();
    }
  }